

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O2

Acec_Box_t * Acec_CreateBox(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Int_t *vTree)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Bit_t *p_00;
  Vec_Bit_t *p_01;
  Vec_Bit_t *p_02;
  Acec_Box_t *pAVar7;
  Vec_Wec_t *vBoxes;
  Vec_Wec_t *p_03;
  Vec_Wec_t *p_04;
  Vec_Int_t *pVVar8;
  Vec_Int_t *p_05;
  int iVar9;
  
  iVar1 = Acec_CreateBoxMaxRank(vTree);
  p_00 = Vec_BitStart(vAdds->nSize / 6);
  p_01 = Vec_BitStart(p->nObjs);
  p_02 = Vec_BitStart(p->nObjs);
  pAVar7 = (Acec_Box_t *)calloc(1,0x30);
  pAVar7->pGia = p;
  vBoxes = Vec_WecStart(iVar1 + 1);
  pAVar7->vAdds = vBoxes;
  p_03 = Vec_WecStart(iVar1 + 1);
  pAVar7->vLeafLits = p_03;
  p_04 = Vec_WecStart(iVar1 + 2);
  pAVar7->vRootLits = p_04;
  for (iVar1 = 1; iVar1 < vTree->nSize; iVar1 = iVar1 + 2) {
    iVar2 = Vec_IntEntry(vTree,iVar1 + -1);
    iVar3 = Vec_IntEntry(vTree,iVar1);
    iVar9 = iVar2 * 6;
    iVar4 = Vec_IntEntry(vAdds,iVar9);
    Vec_BitWriteEntry(p_01,iVar4,1);
    iVar4 = Vec_IntEntry(vAdds,iVar9 + 1);
    Vec_BitWriteEntry(p_01,iVar4,1);
    iVar4 = Vec_IntEntry(vAdds,iVar9 + 2);
    Vec_BitWriteEntry(p_01,iVar4,1);
    iVar4 = Vec_IntEntry(vAdds,iVar9 + 3);
    Vec_BitWriteEntry(p_02,iVar4,1);
    iVar4 = Vec_IntEntry(vAdds,iVar9 + 4);
    Vec_BitWriteEntry(p_02,iVar4,1);
    Vec_WecPush(vBoxes,iVar3,iVar2);
  }
  for (iVar1 = 0; iVar1 < vBoxes->nSize; iVar1 = iVar1 + 1) {
    pVVar8 = Vec_WecEntry(vBoxes,iVar1);
    Vec_IntSort(pVVar8,0);
  }
  pVVar8 = Acec_TreeCarryMap(p,vAdds,vBoxes);
  iVar1 = vBoxes->nSize;
  while (0 < iVar1) {
    iVar1 = iVar1 + -1;
    p_05 = Vec_WecEntry(vBoxes,iVar1);
    for (iVar2 = 0; iVar2 < p_05->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(p_05,iVar2);
      iVar9 = iVar3 * 6 + 4;
      iVar4 = Vec_IntEntry(vAdds,iVar9);
      iVar4 = Vec_BitEntry(p_01,iVar4);
      if (iVar4 == 0) {
        iVar4 = Vec_IntEntry(vAdds,iVar9);
        iVar3 = Vec_IntEntry(vAdds,iVar3 * 6 + 2);
        Acec_TreePhases_rec(p,vAdds,pVVar8,iVar4,(uint)(iVar3 != 0),p_00);
      }
    }
  }
  Acec_TreeVerifyPhases(p,vAdds,vBoxes);
  Acec_TreeVerifyPhases2(p,vAdds,vBoxes);
  Vec_BitFree(p_00);
  Vec_IntFree(pVVar8);
  Vec_BitWriteEntry(p_02,0,1);
  for (iVar1 = 0; iVar1 < vBoxes->nSize; iVar1 = iVar1 + 1) {
    pVVar8 = Vec_WecEntry(vBoxes,iVar1);
    for (iVar2 = 0; iVar2 < pVVar8->nSize; iVar2 = iVar2 + 1) {
      iVar3 = Vec_IntEntry(pVVar8,iVar2);
      iVar9 = iVar3 * 6;
      for (iVar4 = 0; iVar4 != 3; iVar4 = iVar4 + 1) {
        iVar5 = Vec_IntEntry(vAdds,iVar9 + iVar4);
        iVar5 = Vec_BitEntry(p_02,iVar5);
        if (iVar5 == 0) {
          iVar5 = Vec_IntEntry(vAdds,iVar9 + iVar4);
          iVar6 = Acec_SignBit2(vAdds,iVar3,iVar4);
          iVar5 = Abc_Var2Lit(iVar5,iVar6);
          Vec_WecPush(p_03,iVar1,iVar5);
        }
      }
      for (iVar4 = 3; iVar4 != 5; iVar4 = iVar4 + 1) {
        iVar5 = Vec_IntEntry(vAdds,iVar9 + iVar4);
        iVar5 = Vec_BitEntry(p_01,iVar5);
        if (iVar5 == 0) {
          iVar5 = Vec_IntEntry(vAdds,iVar9 + iVar4);
          iVar6 = Acec_SignBit2(vAdds,iVar3,iVar4);
          iVar5 = Abc_Var2Lit(iVar5,iVar6);
          Vec_WecPush(p_04,(uint)(iVar4 == 4) + iVar1,iVar5);
        }
      }
      iVar4 = Vec_IntEntry(vAdds,iVar9 + 2);
      if ((iVar4 == 0) && (iVar3 = Acec_SignBit2(vAdds,iVar3,2), iVar3 != 0)) {
        Vec_WecPush(p_03,iVar1,1);
      }
    }
  }
  Vec_BitFree(p_01);
  Vec_BitFree(p_02);
  for (iVar1 = 0; iVar1 < p_03->nSize; iVar1 = iVar1 + 1) {
    pVVar8 = Vec_WecEntry(p_03,iVar1);
    Vec_IntSort(pVVar8,0);
  }
  for (iVar1 = 0; iVar1 < p_04->nSize; iVar1 = iVar1 + 1) {
    pVVar8 = Vec_WecEntry(p_04,iVar1);
    Vec_IntSort(pVVar8,1);
  }
  return pAVar7;
}

Assistant:

Acec_Box_t * Acec_CreateBox( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vTree )
{
    int MaxRank = Acec_CreateBoxMaxRank(vTree);
    Vec_Bit_t * vVisit  = Vec_BitStart( Vec_IntSize(vAdds)/6 );
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel, * vMap;
    int i, j, k, Box, Rank;//, Count = 0;

    Acec_Box_t * pBox = ABC_CALLOC( Acec_Box_t, 1 );
    pBox->pGia        = p;
    pBox->vAdds       = Vec_WecStart( MaxRank + 1 );
    pBox->vLeafLits   = Vec_WecStart( MaxRank + 1 );
    pBox->vRootLits   = Vec_WecStart( MaxRank + 2 );

    // collect boxes; mark inputs/outputs
    Vec_IntForEachEntryDouble( vTree, Box, Rank, i )
    {
//        if ( 37 == Box && 6 == Rank )
//        {
//            printf( "Skipping one adder...\n" );
//            continue;
//        }
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
        Vec_WecPush( pBox->vAdds, Rank, Box );
    }
    // sort each level
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntSort( vLevel, 0 );

    // set phases starting from roots
    vMap = Acec_TreeCarryMap( p, vAdds, pBox->vAdds );
    Vec_WecForEachLevelReverse( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4) ) )
            {
                //printf( "Pushing phase of output %d of box %d\n", Vec_IntEntry(vAdds, 6*Box+4), Box );
                Acec_TreePhases_rec( p, vAdds, vMap, Vec_IntEntry(vAdds, 6*Box+4), Vec_IntEntry(vAdds, 6*Box+2) != 0, vVisit );
            }
    Acec_TreeVerifyPhases( p, vAdds, pBox->vAdds );
    Acec_TreeVerifyPhases2( p, vAdds, pBox->vAdds );
    Vec_BitFree( vVisit );
    Vec_IntFree( vMap );

    // collect inputs/outputs
    Vec_BitWriteEntry( vIsRoot, 0, 1 );
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, j )
        {
            for ( k = 0; k < 3; k++ )
                if ( !Vec_BitEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vLeafLits, i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            for ( k = 3; k < 5; k++ )
                if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+k) ) )
                {
                    //if ( Vec_IntEntry(vAdds, 6*Box+k) == 10942 )
                    //{
                    //    printf( "++++++++++++ Skipping special\n" );
                    //    continue;
                    //}
                    Vec_WecPush( pBox->vRootLits, k == 4 ? i + 1 : i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
                }
            if ( Vec_IntEntry(vAdds, 6*Box+2) == 0 && Acec_SignBit2(vAdds, Box, 2) )
                Vec_WecPush( pBox->vLeafLits, i, 1 );
        }
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vIsRoot );
    // sort each level
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntSort( vLevel, 1 );
    //return pBox;
/*
    // push literals forward
    //Vec_WecPrint( pBox->vLeafLits, 0 );
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
    {
        int This, Prev = Vec_IntEntry(vLevel, 0);
        Vec_IntForEachEntryStart( vLevel, This, j, 1 )
        {
            if ( Prev != This )
            {
                Prev = This;
                continue;
            }
            if ( i+1 >= Vec_WecSize(pBox->vLeafLits) )
                continue;
            Vec_IntPushOrder( Vec_WecEntry(pBox->vLeafLits, i+1), This );
            Vec_IntDrop( vLevel, j-- );
            Vec_IntDrop( vLevel, j-- );
            Prev = -1;
            Count++;
        }
    }
    printf( "Pushed forward %d input literals.\n", Count );
*/
    //Vec_WecPrint( pBox->vLeafLits, 0 );
    return pBox;
}